

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::analyze(Internal *this)

{
  int64_t *piVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  Internal *this_00;
  pointer piVar3;
  pointer pVVar4;
  ulong *puVar5;
  pointer piVar6;
  pointer puVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Clause *pCVar13;
  ulong uVar14;
  time_t *in_RSI;
  Internal *pIVar15;
  time_t *__timer;
  uint uVar16;
  ulong *puVar17;
  vector<int,_std::allocator<int>_> *this_01;
  pointer puVar18;
  int iVar19;
  double s;
  double s_00;
  double s_01;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int resolvent_size;
  uint local_6c;
  int local_68;
  int open;
  double local_60;
  int jump;
  undefined4 uStack_54;
  Internal *local_50;
  uint local_48;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  EMA *local_38;
  
  pIVar15 = this->internal;
  if ((pIVar15->profiles).analyze.level <= (pIVar15->opts).profile) {
    time(pIVar15,in_RSI);
    start_profiling(pIVar15,&(pIVar15->profiles).analyze,s);
    pIVar15 = this->internal;
  }
  auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar21._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar21._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.fast,pIVar15,
              (auVar21._8_8_ - 1.9342813113834067e+25) + (auVar21._0_8_ - 4503599627370496.0),
              "averages.current.trail.fast");
  pIVar15 = this->internal;
  auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_assigned);
  auVar22._8_4_ = (int)(this->num_assigned >> 0x20);
  auVar22._12_4_ = 0x45300000;
  EMA::update(&(this->averages).current.trail.slow,pIVar15,
              (auVar22._8_8_ - 1.9342813113834067e+25) + (auVar22._0_8_ - 4503599627370496.0),
              "averages.current.trail.slow");
  if (((this->external_prop == true) && (this->external_prop_is_lazy == false)) &&
     ((this->opts).exteagerreasons != 0)) {
    explain_external_propagations(this);
  }
  if (((this->opts).chrono != 0) || (this->external_prop == true)) {
    uVar10 = find_conflict_level(this,&jump);
    if (jump != 0) {
      backtrack(this,uVar10 - 1);
      build_chain_for_units(this,jump,this->conflict,false);
      pIVar15 = (Internal *)(_jump & 0xffffffff);
      search_assign_driving(this,jump,this->conflict);
      this->conflict = (Clause *)0x0;
      goto LAB_00635859;
    }
    pIVar15 = (Internal *)(ulong)uVar10;
    backtrack(this,uVar10);
  }
  if (this->level != 0) {
    local_38 = (EMA *)&(this->averages).current;
    pCVar13 = this->conflict;
    uVar14 = (ulong)((long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    open = 0;
    resolvent_size = 0;
    local_44 = (this->opts).otfs;
    local_40 = &this->clause;
    uVar16 = 0;
    local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
    uVar10 = 0;
    local_50 = this;
    do {
      this = local_50;
      local_68 = 1;
      analyze_reason(local_50,uVar10,pCVar13,&open,&resolvent_size,&local_68);
      iVar11 = local_68 + -1;
      if (uVar16 != 0) {
        iVar11 = local_60._0_4_;
      }
      if (((local_44 != 0) && (0 < (int)uVar16)) && ((2 < local_68 && (resolvent_size < local_68))))
      {
        local_6c = *(uint *)&pCVar13[1].field_0;
        local_48 = *(uint *)((long)&pCVar13[1].field_0 + 4);
        pCVar13 = on_the_fly_strengthen(this,pCVar13,uVar10);
        if ((this->opts).bump != 0) {
          bump_variables(this);
        }
        if (pCVar13 == (Clause *)0x0) {
          uVar16 = local_6c ^ local_48;
          std::
          __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((this->mini_chain).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->mini_chain).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          this_01 = local_40;
          puVar5 = (this->mini_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pvVar2 = &this->lrat_chain;
          for (puVar17 = (this->mini_chain).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; this = local_50, puVar17 != puVar5;
              puVar17 = puVar17 + 1) {
            _jump = *puVar17;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (pvVar2,(value_type_conflict5 *)&jump);
          }
          puVar18 = (local_50->mini_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((local_50->mini_chain).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar18) {
            (local_50->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar18;
          }
          uVar10 = -(uVar16 ^ uVar10);
          clear_analyzed_levels(local_50);
          piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar3) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar3;
          }
LAB_00635bcf:
          uVar16 = -uVar10;
          _jump = CONCAT44(uStack_54,uVar16);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,&jump);
          piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar6 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar11 = (int)((ulong)((long)(this->levels).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->levels).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
          local_60 = (double)iVar11;
          EMA::update(local_38,this->internal,local_60,"averages.current.glue.fast");
          EMA::update(&(this->averages).current.glue.slow,this->internal,local_60,
                      "averages.current.glue.slow");
          iVar19 = (int)((ulong)((long)piVar3 - (long)piVar6) >> 2);
          lVar9 = (this->stats).learned.clauses;
          (this->stats).learned.literals = (long)iVar19 + (this->stats).learned.literals;
          (this->stats).learned.clauses = lVar9 + 1;
          if (iVar19 < 2) {
            if (this->external->learner != (Learner *)0x0) {
              External::export_learned_unit_clause(this->external,uVar16);
            }
          }
          else {
            if ((this->opts).shrink == 0) {
              if ((this->opts).minimize != 0) {
                minimize_clause(this);
              }
            }
            else {
              shrink_and_minimize_clause(this);
            }
            iVar19 = (int)((ulong)((long)(this->clause).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2);
            if ((this->opts).bump != 0) {
              bump_variables(this);
            }
            if (this->external->learner != (Learner *)0x0) {
              External::export_learned_large_clause(this->external,this_01);
            }
          }
          auVar20._0_4_ = -(uint)(iVar19 == 1);
          auVar20._4_4_ = -(uint)(iVar19 == 2);
          auVar20._8_4_ = -(uint)(iVar19 == 2);
          auVar20._12_4_ = 0xffffffff;
          auVar20 = auVar20 & _DAT_00766d40;
          (this->stats).units = (this->stats).units + auVar20._0_8_;
          (this->stats).binaries = (this->stats).binaries + auVar20._8_8_;
          EMA::update(&(this->averages).current.size,this->internal,(double)iVar19,
                      "averages.current.size");
          if (this->lrat == true) {
            puVar7 = (this->unit_chain).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pvVar2 = &this->lrat_chain;
            local_6c = uVar10;
            for (puVar18 = (this->unit_chain).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; this = local_50, puVar18 != puVar7;
                puVar18 = puVar18 + 1) {
              _jump = *puVar18;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (pvVar2,(value_type_conflict5 *)&jump);
            }
            puVar18 = (local_50->unit_chain).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((local_50->unit_chain).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar18) {
              (local_50->unit_chain).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar18;
            }
            std::
            __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((local_50->lrat_chain).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (local_50->lrat_chain).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            uVar10 = local_6c;
          }
          pCVar13 = new_driving_clause(this,iVar11,&jump);
          iVar11 = jump;
          EMA::update(&(this->averages).current.jump,this->internal,(double)jump,
                      "averages.current.jump");
          uVar12 = determine_actual_backtrack_level(this,iVar11);
          EMA::update(&(this->averages).current.level,this->internal,(double)(int)uVar12,
                      "averages.current.level");
          __timer = (time_t *)(ulong)uVar12;
          backtrack(this,uVar12);
          if (uVar10 == 0) {
            learn_empty_clause(this);
          }
          else {
            __timer = (time_t *)(ulong)uVar16;
            search_assign_driving(this,uVar16,pCVar13);
          }
          if (this->stable == true) {
            Reluctant::tick(&this->reluctant);
          }
          clear_analyzed_literals(this);
          clear_unit_analyzed_literals(this);
          clear_analyzed_levels(this);
          piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar3) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar3;
          }
          this->conflict = (Clause *)0x0;
          puVar18 = (this->lrat_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar18) {
            (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar18;
          }
          pIVar15 = this->internal;
          if ((pIVar15->profiles).analyze.level <= (pIVar15->opts).profile) {
            time(pIVar15,__timer);
            stop_profiling(pIVar15,&(pIVar15->profiles).analyze,s_01);
          }
          if (pCVar13 == (Clause *)0x0) {
            return;
          }
          if ((this->opts).eagersubsume == 0) {
            return;
          }
          eagerly_subsume_recently_learned_clauses(this,pCVar13);
          return;
        }
        if ((uVar16 == 1) && (resolvent_size < local_60._0_4_)) {
          otfs_subsume_clause(this,pCVar13,this->conflict);
          piVar1 = &(this->stats).otfs.subsumed;
          *piVar1 = *piVar1 + 1;
          piVar1 = &(this->stats).subsumed;
          *piVar1 = *piVar1 + 1;
          piVar1 = &(this->stats).conflicts;
          *piVar1 = *piVar1 + 1;
        }
        this->conflict = pCVar13;
        if (open == 1) {
          _jump = _jump & 0xffffffff00000000;
          iVar11 = otfs_find_backtrack_level(this,&jump);
          iVar11 = determine_actual_backtrack_level(this,iVar11);
          EMA::update(&(this->averages).current.level,this->internal,(double)iVar11,
                      "averages.current.level");
          backtrack(this,iVar11);
          pIVar15 = (Internal *)(_jump & 0xffffffff);
          search_assign_driving(this,jump,this->conflict);
          this->conflict = (Clause *)0x0;
          clear_analyzed_literals(this);
          clear_analyzed_levels(this);
          piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar3) {
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar3;
          }
          goto LAB_00635859;
        }
        clear_analyzed_literals(this);
        piVar3 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3;
        }
        resolvent_size = 0;
        local_68 = 1;
        open = 0;
        uVar16 = 0;
        analyze_reason(this,0,pCVar13,&open,&resolvent_size,&local_68);
        iVar11 = local_68 + -1;
      }
      pIVar15 = local_50;
      local_60 = (double)CONCAT44(local_60._4_4_,iVar11);
      pVVar4 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = (ulong)(int)uVar14;
      uVar10 = 0;
      while (uVar10 == 0) {
        uVar12 = (this->trail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14 - 1];
        uVar8 = -uVar12;
        if (0 < (int)uVar12) {
          uVar8 = uVar12;
        }
        uVar10 = 0;
        if ((((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8] & 1) != 0) &&
           (uVar10 = uVar12, pVVar4[uVar8].level != this->level)) {
          uVar10 = 0;
        }
        uVar14 = uVar14 - 1;
      }
      open = open + -1;
      this_01 = local_40;
      if (open == 0) goto LAB_00635bcf;
      uVar12 = uVar10;
      if ((int)uVar10 < 1) {
        uVar12 = -uVar10;
      }
      pCVar13 = pVVar4[uVar12].reason;
      if (pCVar13 == this->external_reason) {
        local_6c = uVar16;
        pCVar13 = learn_external_reason_clause(local_50,-uVar10,0,true);
        (pIVar15->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12].reason = pCVar13;
        uVar16 = local_6c;
      }
      uVar16 = uVar16 + 1;
      resolvent_size = resolvent_size + -1;
    } while( true );
  }
  learn_empty_clause(this);
  if (this->external->learner != (Learner *)0x0) {
    External::export_learned_empty_clause(this->external);
  }
LAB_00635859:
  this_00 = this->internal;
  if ((this_00->profiles).analyze.level <= (this_00->opts).profile) {
    time(this_00,(time_t *)pIVar15);
    stop_profiling(this_00,&(this_00->profiles).analyze,s_00);
  }
  return;
}

Assistant:

void Internal::analyze () {

  START (analyze);

  assert (conflict);
  assert (lrat_chain.empty ());
  assert (unit_chain.empty ());
  assert (unit_analyzed.empty ());
  assert (clause.empty ());

  // First update moving averages of trail height at conflict.
  //
  UPDATE_AVERAGE (averages.current.trail.fast, num_assigned);
  UPDATE_AVERAGE (averages.current.trail.slow, num_assigned);

  /*----------------------------------------------------------------------*/

  if (external_prop && !external_prop_is_lazy && opts.exteagerreasons) {
    explain_external_propagations ();
  }

  if (opts.chrono || external_prop) {

    int forced;

    const int conflict_level = find_conflict_level (forced);

    // In principle we can perform conflict analysis as in non-chronological
    // backtracking except if there is only one literal with the maximum
    // assignment level in the clause.  Then standard conflict analysis is
    // unnecessary and we can use the conflict as a driving clause.  In the
    // pseudo code of the SAT'18 paper on chronological backtracking this
    // corresponds to the situation handled in line 4-6 in Alg. 1, except
    // that the pseudo code in the paper only backtracks while we eagerly
    // assign the single literal on the highest decision level.

    if (forced) {

      assert (forced);
      assert (conflict_level > 0);
      LOG ("single highest level literal %d", forced);

      // The pseudo code in the SAT'18 paper actually backtracks to the
      // 'second highest decision' level, while their code backtracks
      // to 'conflict_level-1', which is more in the spirit of chronological
      // backtracking anyhow and thus we also do the latter.
      //
      backtrack (conflict_level - 1);

      // if we are on decision level 0 search assign will learn unit
      // so we need a valid chain here (of course if we are not on decision
      // level 0 this will not result in a valid chain).
      // we can just use build_chain_for_units in propagate
      //
      build_chain_for_units (forced, conflict, 0);

      LOG ("forcing %d", forced);
      search_assign_driving (forced, conflict);

      conflict = 0;
      STOP (analyze);
      return;
    }

    // Backtracking to the conflict level is in the pseudo code in the
    // SAT'18 chronological backtracking paper, but not in their actual
    // implementation.  In principle we do not need to backtrack here.
    // However, as a side effect of backtracking to the conflict level we
    // set 'level' to the conflict level which then allows us to reuse the
    // old 'analyze' code as is.  The alternative (which we also tried but
    // then abandoned) is to use 'conflict_level' instead of 'level' in the
    // analysis, which however requires to pass it to the 'analyze_reason'
    // and 'analyze_literal' functions.
    //
    backtrack (conflict_level);
  }

  // Actual conflict on root level, thus formula unsatisfiable.
  //
  if (!level) {
    learn_empty_clause ();
    if (external->learner)
      external->export_learned_empty_clause ();
    // lrat_chain.clear (); done in learn_empty_clause
    STOP (analyze);
    return;
  }

  /*----------------------------------------------------------------------*/

  // First derive the 1st UIP clause by going over literals assigned on the
  // current decision level.  Literals in the conflict are marked as 'seen'
  // as well as all literals in reason clauses of already 'seen' literals on
  // the current decision level.  Thus the outer loop starts with the
  // conflict clause as 'reason' and then uses the 'reason' of the next
  // seen literal on the trail assigned on the current decision level.
  // During this process maintain the number 'open' of seen literals on the
  // current decision level with not yet processed 'reason'.  As soon 'open'
  // drops to one, we have found the first unique implication point.  This
  // is sound because the topological order in which literals are processed
  // follows the assignment order and a more complex algorithm to find
  // articulation points is not necessary.
  //
  Clause *reason = conflict;
  LOG (reason, "analyzing conflict");

  assert (clause.empty ());
  assert (lrat_chain.empty ());

  const auto &t = &trail;
  int i = t->size ();      // Start at end-of-trail.
  int open = 0;            // Seen but not processed on this level.
  int uip = 0;             // The first UIP literal.
  int resolvent_size = 0;  // without the uip
  int antecedent_size = 1; // with the uip and without unit literals
  int conflict_size =
      0; // size of the conflict without the uip and without unit literals
  int resolved = 0; // number of resolution (0 = clause in CNF)
  const bool otfs = opts.otfs;

  for (;;) {
    antecedent_size = 1; // for uip
    analyze_reason (uip, reason, open, resolvent_size, antecedent_size);
    if (resolved == 0)
      conflict_size = antecedent_size - 1;
    assert (resolvent_size == open + (int) clause.size ());

    if (otfs && resolved > 0 && antecedent_size > 2 &&
        resolvent_size < antecedent_size) {
      assert (reason != conflict);
      LOG (analyzed, "found candidate for OTFS conflict");
      LOG (clause, "found candidate for OTFS conflict");
      LOG (reason, "found candidate (size %d) for OTFS resolvent",
           antecedent_size);
      const int other = reason->literals[0] ^ reason->literals[1] ^ uip;
      assert (other != uip);
      reason = on_the_fly_strengthen (reason, uip);
      if (opts.bump)
        bump_variables ();

      assert (conflict_size);
      if (!reason) {
        uip = -other;
        assert (open == 1);
        LOG ("clause is actually unit %d, stopping", -uip);
        reverse (begin (mini_chain), end (mini_chain));
        for (auto id : mini_chain)
          lrat_chain.push_back (id);
        mini_chain.clear ();
        clear_analyzed_levels ();
        assert (!opts.exteagerreasons);
        clause.clear ();
        break;
      }
      assert (conflict_size >= 2);

      if (resolved == 1 && resolvent_size < conflict_size) {
        // in this case both clauses are part of the CNF, so one subsumes
        // the other
        otfs_subsume_clause (reason, conflict);
        LOG (reason, "changing conflict to");
        --conflict_size;
        assert (conflict_size == reason->size);
        ++stats.otfs.subsumed;
        ++stats.subsumed;
        ++stats.conflicts;
      }

      LOG (reason, "changing conflict to");
      conflict = reason;
      if (open == 1) {
        int forced = 0;
        const int conflict_level = otfs_find_backtrack_level (forced);
        int new_level = determine_actual_backtrack_level (conflict_level);
        UPDATE_AVERAGE (averages.current.level, new_level);
        backtrack (new_level);

        LOG ("forcing %d", forced);
        search_assign_driving (forced, conflict);

        conflict = 0;
        // Clean up.
        //
        clear_analyzed_literals ();
        clear_analyzed_levels ();
        clause.clear ();
        STOP (analyze);
        return;
      }

      resolved = 0;
      clear_analyzed_literals ();
      // clear_analyzed_levels (); not needed because marking the exact same
      // again
      clause.clear ();
      resolvent_size = 0;
      antecedent_size = 1;
      open = 0;
      analyze_reason (0, reason, open, resolvent_size, antecedent_size);
      conflict_size = antecedent_size - 1;
      assert (open > 1);
    }

    ++resolved;

    uip = 0;
    while (!uip) {
      assert (i > 0);
      const int lit = (*t)[--i];
      if (!flags (lit).seen)
        continue;
      if (var (lit).level == level)
        uip = lit;
    }
    if (!--open)
      break;
    reason = var (uip).reason;
    if (reason == external_reason) {
      assert (!opts.exteagerreasons);
      reason = learn_external_reason_clause (-uip, 0, true);
      var (uip).reason = reason;
    }
    assert (reason != external_reason);
    LOG (reason, "analyzing %d reason", uip);
    assert (resolvent_size);
    --resolvent_size;
  }
  LOG ("first UIP %d", uip);
  clause.push_back (-uip);

  // Update glue and learned (1st UIP literals) statistics.
  //
  int size = (int) clause.size ();
  const int glue = (int) levels.size () - 1;
  LOG (clause, "1st UIP size %d and glue %d clause", size, glue);
  UPDATE_AVERAGE (averages.current.glue.fast, glue);
  UPDATE_AVERAGE (averages.current.glue.slow, glue);
  stats.learned.literals += size;
  stats.learned.clauses++;
  assert (glue < size);

  // up to this point lrat_chain contains the proof for current clause in
  // reversed order. in minimize and shrink the clause is changed and
  // therefore lrat_chain has to be extended. Unfortunately we cannot create
  // the chain directly during minimization (or shrinking) but afterwards we
  // can calculate it pretty easily and even better the same algorithm works
  // for both shrinking and minimization.

  // Minimize the 1st UIP clause as pioneered by Niklas Soerensson in
  // MiniSAT and described in our joint SAT'09 paper.
  //
  if (size > 1) {
    if (opts.shrink)
      shrink_and_minimize_clause ();
    else if (opts.minimize)
      minimize_clause ();

    size = (int) clause.size ();

    // Update decision heuristics.
    //
    if (opts.bump)
      bump_variables ();

    if (external->learner)
      external->export_learned_large_clause (clause);
  } else if (external->learner)
    external->export_learned_unit_clause (-uip);

  // Update actual size statistics.
  //
  stats.units += (size == 1);
  stats.binaries += (size == 2);
  UPDATE_AVERAGE (averages.current.size, size);

  // reverse lrat_chain. We could probably work with reversed iterators
  // (views) to be more efficient but we would have to distinguish in proof
  //
  if (lrat) {
    LOG (unit_chain, "unit chain: ");
    for (auto id : unit_chain)
      lrat_chain.push_back (id);
    unit_chain.clear ();
    reverse (lrat_chain.begin (), lrat_chain.end ());
  }

  // Determine back-jump level, learn driving clause, backtrack and assign
  // flipped 1st UIP literal.
  //
  int jump;
  Clause *driving_clause = new_driving_clause (glue, jump);
  UPDATE_AVERAGE (averages.current.jump, jump);

  int new_level = determine_actual_backtrack_level (jump);
  UPDATE_AVERAGE (averages.current.level, new_level);
  backtrack (new_level);

  // It should hold that (!level <=> size == 1)
  //                 and (!uip   <=> size == 0)
  // this means either we have already learned a clause => size >= 2
  // in this case we will not learn empty clause or unit here
  // or we haven't actually learned a clause in new_driving_clause
  // then lrat_chain is still valid and we will learn a unit or empty clause
  //
  if (uip) {
    search_assign_driving (-uip, driving_clause);
  } else
    learn_empty_clause ();

  if (stable)
    reluctant.tick (); // Reluctant has its own 'conflict' counter.

  // Clean up.
  //
  clear_analyzed_literals ();
  clear_unit_analyzed_literals ();
  clear_analyzed_levels ();
  clause.clear ();
  conflict = 0;

  lrat_chain.clear ();
  STOP (analyze);

  if (driving_clause && opts.eagersubsume)
    eagerly_subsume_recently_learned_clauses (driving_clause);
}